

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void Qiniu_Client_Cleanup(Qiniu_Client *self)

{
  Qiniu_Client *self_local;
  
  if ((self->auth).itbl != (Qiniu_Auth_Itbl *)0x0) {
    (*((self->auth).itbl)->Release)((self->auth).self);
    (self->auth).itbl = (Qiniu_Auth_Itbl *)0x0;
  }
  if (self->curl != (void *)0x0) {
    curl_easy_cleanup(self->curl);
    self->curl = (void *)0x0;
  }
  if (self->root != (Qiniu_Json *)0x0) {
    cJSON_Delete(self->root);
    self->root = (Qiniu_Json *)0x0;
  }
  Qiniu_Buffer_Cleanup(&self->b);
  Qiniu_Buffer_Cleanup(&self->respHeader);
  if (self->cachedRegions != (hashmap *)0x0) {
    hashmap_free(self->cachedRegions);
    self->cachedRegions = (hashmap *)0x0;
  }
  self->enableUploadingAcceleration = 0;
  return;
}

Assistant:

void Qiniu_Client_Cleanup(Qiniu_Client *self)
{
    if (self->auth.itbl != NULL)
    {
        self->auth.itbl->Release(self->auth.self);
        self->auth.itbl = NULL;
    }
    if (self->curl != NULL)
    {
        curl_easy_cleanup((CURL *)self->curl);
        self->curl = NULL;
    }
    if (self->root != NULL)
    {
        cJSON_Delete(self->root);
        self->root = NULL;
    }
    Qiniu_Buffer_Cleanup(&self->b);
    Qiniu_Buffer_Cleanup(&self->respHeader);

    if (self->cachedRegions != NULL)
    {
        hashmap_free(self->cachedRegions);
        self->cachedRegions = NULL;
    }
    self->enableUploadingAcceleration = Qiniu_False;
}